

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

S2Point * __thiscall
s2textformat::MakePointOrDie(S2Point *__return_storage_ptr__,s2textformat *this,string_view str)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_38;
  
  piece.ptr_ = str.ptr_;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  str_00.length_ = (size_type)piece.ptr_;
  str_00.ptr_ = (char *)this;
  bVar1 = MakePoint(str_00,__return_storage_ptr__);
  if (!bVar1) {
    sVar3 = 3;
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x60,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: MakePoint(str, &point) ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(SStack_38.stream_,": str == \"",10);
    piece.length_ = sVar3;
    poVar2 = absl::operator<<((absl *)SStack_38.stream_,(ostream *)this,piece);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (!bVar1) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point MakePointOrDie(string_view str) {
  S2Point point;
  S2_CHECK(MakePoint(str, &point)) << ": str == \"" << str << "\"";
  return point;
}